

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O1

int listcode(lua_State *L)

{
  byte bVar1;
  StkId pTVar2;
  lua_CFunction p_Var3;
  long lVar4;
  char *pcVar5;
  int iVar6;
  size_t sVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  char *pcVar11;
  ulong uVar12;
  ulong n;
  char buff [100];
  char local_98 [104];
  
  iVar6 = lua_type(L,1);
  if (iVar6 == 6) {
    iVar6 = lua_iscfunction(L,1);
    if (iVar6 == 0) goto LAB_001338da;
  }
  luaL_argerror(L,1,"Lua function expected");
LAB_001338da:
  pTVar2 = L->ci->func;
  if (pTVar2[1].tt_ == 0x8006) {
    p_Var3 = pTVar2[1].value_.f;
    if (p_Var3[8] == (_func_int_lua_State_ptr)0x6) {
      lVar4 = *(long *)(p_Var3 + 0x18);
      lua_createtable(L,0,0);
      lua_pushinteger(L,(ulong)*(byte *)(lVar4 + 0xc));
      lua_setfield(L,-2,"maxstack");
      lua_pushinteger(L,(ulong)*(byte *)(lVar4 + 10));
      lua_setfield(L,-2,"numparams");
      if (0 < *(int *)(lVar4 + 0x18)) {
        uVar12 = 0;
        do {
          n = uVar12 + 1;
          lua_pushinteger(L,n);
          if (*(long *)(lVar4 + 0x48) == 0) {
            uVar9 = 0xffffffff;
          }
          else {
            uVar9 = (ulong)*(uint *)(*(long *)(lVar4 + 0x48) + uVar12 * 4);
          }
          uVar10 = *(uint *)(*(long *)(lVar4 + 0x38) + uVar12 * 4);
          pcVar5 = luaP_opnames[uVar10 & 0xff];
          sprintf(local_98,"(%4d) %4d - ",uVar9,uVar12 & 0xffffffff);
          bVar1 = luaP_opmodes[uVar10 & 0xff];
          sVar7 = strlen(local_98);
          pcVar11 = local_98 + sVar7;
          uVar8 = uVar10 >> 8;
          switch(bVar1 & 3) {
          case 0:
            sprintf(pcVar11,"%-12s%4d %4d %4d",pcVar5,(ulong)(uVar8 & 0x7f),(ulong)(uVar10 >> 0x18),
                    (ulong)(uVar10 >> 0x10 & 0xff));
            break;
          case 1:
            uVar10 = uVar10 >> 0x10;
            goto LAB_00133a38;
          case 2:
            uVar10 = (uVar10 >> 0x10) - 0x8000;
LAB_00133a38:
            sprintf(pcVar11,"%-12s%4d %4d",pcVar5,(ulong)(uVar8 & 0x7f),(ulong)uVar10);
            break;
          case 3:
            sprintf(pcVar11,"%-12s%4d",pcVar5,(ulong)uVar8);
          }
          lua_pushstring(L,local_98);
          lua_settable(L,-3);
          uVar12 = n;
        } while ((long)n < (long)*(int *)(lVar4 + 0x18));
      }
      return 1;
    }
    pcVar11 = "((((L->ci->func + (1)))->value_).gc)->tt == ((6) | ((0) << 4))";
  }
  else {
    pcVar11 = "(((((L->ci->func + (1))))->tt_) == (((((6) | ((0) << 4))) | (1 << 15))))";
  }
  __assert_fail(pcVar11,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                ,0x265,"int listcode(lua_State *)");
}

Assistant:

static int listcode (lua_State *L) {
  int pc;
  Proto *p;
  luaL_argcheck(L, lua_isfunction(L, 1) && !lua_iscfunction(L, 1),
                 1, "Lua function expected");
  p = getproto(obj_at(L, 1));
  lua_newtable(L);
  setnameval(L, "maxstack", p->maxstacksize);
  setnameval(L, "numparams", p->numparams);
  for (pc=0; pc<p->sizecode; pc++) {
    char buff[100];
    lua_pushinteger(L, pc+1);
    lua_pushstring(L, buildop(p, pc, buff));
    lua_settable(L, -3);
  }
  return 1;
}